

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_13::smart_ban_plugin::on_piece_failed
          (smart_ban_plugin *this,piece_index_t p)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  _func_void *p_Var6;
  piece_block pVar7;
  pointer pptVar8;
  peer_request r;
  enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin> local_108;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  smart_ban_plugin *local_d8;
  enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin> *local_d0;
  pointer local_c8;
  pointer local_c0;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  _Tuple_impl<1UL,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
  local_90;
  undefined8 local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  address local_50;
  
  if (((this->m_torrent->super_torrent_hot_members).field_0x4b & 4) == 0) {
    aux::piece_picker::get_downloaders
              (&downloaders,
               (this->m_torrent->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,p);
    iVar4 = file_storage::piece_size
                      (&((this->m_torrent->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_files,p);
    r.start = 0;
    r.length = 0x4000;
    if (iVar4 < 0x4000) {
      r.length = iVar4;
    }
    local_c8 = downloaders.
               super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d0 = &this->
                super_enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin>;
    pVar7.block_index = 0;
    pVar7.piece_index.m_val = p.m_val;
    r.piece.m_val = p.m_val;
    local_d8 = this;
    for (pptVar8 = downloaders.
                   super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; iVar4 = iVar4 + -0x4000,
        pptVar8 != local_c8; pptVar8 = pptVar8 + 1) {
      if (*pptVar8 != (torrent_peer *)0x0) {
        iVar5 = (*(((this->m_torrent->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        uVar1 = (this->m_torrent->m_storage).m_idx.m_val;
        ::std::enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin>::
        shared_from_this(&local_108);
        local_c0 = pptVar8;
        aux::torrent_peer::address(*pptVar8);
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Tuple_impl<3UL,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>.
        super__Tuple_impl<4UL,_int,_std::_Placeholder<2>_>.super__Head_base<4UL,_int,_false>.
        _M_head_impl = (_Tuple_impl<4UL,_int,_std::_Placeholder<2>_>)
                       (_Tuple_impl<4UL,_int,_std::_Placeholder<2>_>)r.length;
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Head_base<2UL,_boost::asio::ip::address,_false>._M_head_impl.type_ = local_50.type_;
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Head_base<2UL,_boost::asio::ip::address,_false>._M_head_impl.ipv4_address_.addr_.
        s_addr = local_50.ipv4_address_.addr_.s_addr;
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Head_base<2UL,_boost::asio::ip::address,_false>._M_head_impl.ipv6_address_.addr_.
        __in6_u._0_8_ = local_50.ipv6_address_.addr_.__in6_u._0_8_;
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Head_base<2UL,_boost::asio::ip::address,_false>._M_head_impl.ipv6_address_.addr_.
        __in6_u._8_8_ = local_50.ipv6_address_.addr_.__in6_u._8_8_;
        local_90.
        super__Tuple_impl<2UL,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        .super__Head_base<2UL,_boost::asio::ip::address,_false>._M_head_impl.ipv6_address_.scope_id_
             = local_50.ipv6_address_.scope_id_;
        local_60 = local_108._M_weak_this.
                   super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        _Stack_58._M_pi =
             local_108._M_weak_this.
             super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_108._M_weak_this.
        super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_108._M_weak_this.
        super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8 = (code *)0x0;
        pcStack_e0 = (code *)0x0;
        local_f8._M_unused._M_object = (void *)0x0;
        local_f8._8_8_ = 0;
        local_90.super__Head_base<1UL,_libtorrent::piece_block,_false>._M_head_impl = pVar7;
        p_Var6 = (_func_void *)operator_new(0x50);
        *(code **)p_Var6 = on_read_failed_block;
        *(undefined8 *)(p_Var6 + 8) = 0;
        ::std::
        _Tuple_impl<1UL,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
        ::_Tuple_impl((_Tuple_impl<1UL,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>_>
                       *)(p_Var6 + 0x10),&local_90);
        uVar2 = _Stack_58._M_pi._0_4_;
        uVar3 = _Stack_58._M_pi._4_4_;
        _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined4 *)(p_Var6 + 0x40) = (undefined4)local_60;
        *(undefined4 *)(p_Var6 + 0x44) = local_60._4_4_;
        *(undefined4 *)(p_Var6 + 0x48) = uVar2;
        *(undefined4 *)(p_Var6 + 0x4c) = uVar3;
        local_60 = (element_type *)0x0;
        pcStack_e0 = ::std::
                     _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>))(libtorrent::piece_block,_boost::asio::ip::address,_libtorrent::disk_buffer_holder,_int,_const_libtorrent::storage_error_&)>_>
                     ::_M_invoke;
        local_e8 = ::std::
                   _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>))(libtorrent::piece_block,_boost::asio::ip::address,_libtorrent::disk_buffer_holder,_int,_const_libtorrent::storage_error_&)>_>
                   ::_M_manager;
        local_f8._M_unused._0_8_ = (undefined8)p_Var6;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x10))
                  ((long *)CONCAT44(extraout_var,iVar5),uVar1,&r,&local_f8,1);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_f8);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_108._M_weak_this.
                    super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        this = local_d8;
        pptVar8 = local_c0;
      }
      r.start = r.start + 0x4000;
      r.length = 0x4000;
      if (iVar4 < 0x4000) {
        r.length = iVar4;
      }
      pVar7 = (piece_block)((long)pVar7 + 0x100000000);
    }
    ::std::
    _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::~_Vector_base(&downloaders.
                     super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   );
  }
  return;
}

Assistant:

void on_piece_failed(piece_index_t const p) override
		{
			// The piece failed the hash check. Record
			// the CRC and origin peer of every block

			// if the torrent is aborted, no point in starting
			// a bunch of read operations on it
			if (m_torrent.is_aborted()) return;

			std::vector<aux::torrent_peer*> const downloaders
				= m_torrent.picker().get_downloaders(p);

			int size = m_torrent.torrent_file().piece_size(p);
			peer_request r = {p, 0, std::min(16*1024, size)};
			piece_block pb(p, 0);
			for (auto const& i : downloaders)
			{
				if (i != nullptr)
				{
					// for very sad and involved reasons, this read need to force a copy out of the cache
					// since the piece has failed, this block is very likely to be replaced with a newly
					// downloaded one very soon, and to get a block by reference would fail, since the
					// block read will have been deleted by the time it gets back to the network thread
					m_torrent.session().disk_thread().async_read(m_torrent.storage(), r
						, std::bind(&smart_ban_plugin::on_read_failed_block
						, shared_from_this(), pb, i->address(), _1, r.length, _2)
						, disk_interface::force_copy);
				}

				r.start += 16*1024;
				size -= 16*1024;
				r.length = std::min(16*1024, size);
				++pb.block_index;
			}
			TORRENT_ASSERT(size <= 0);
		}